

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int message_set_body_amqp_value(MESSAGE_HANDLE message,AMQP_VALUE body_amqp_value)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  
  if (message == (MESSAGE_HANDLE)0x0 || body_amqp_value == (AMQP_VALUE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x4a4;
    }
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
              ,"message_set_body_amqp_value",0x4a3,1,
              "Bad arguments: message = %p, body_amqp_value = %p",message,body_amqp_value);
    return 0x4a4;
  }
  if ((message->body_amqp_value == (AMQP_VALUE)0x0) &&
     ((message->body_amqp_data_count != 0 || (message->body_amqp_sequence_count != 0)))) {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x4ae;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x4ae;
    }
    pcVar5 = "Body is already set to another body type";
    iVar3 = 0x4ad;
  }
  else {
    pAVar2 = amqpvalue_clone(body_amqp_value);
    if (pAVar2 != (AMQP_VALUE)0x0) {
      if (message->body_amqp_value != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(message->body_amqp_value);
      }
      message->body_amqp_value = pAVar2;
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x4b7;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x4b7;
    }
    pcVar5 = "Cannot clone body AMQP value";
    iVar3 = 0x4b6;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c",
            "message_set_body_amqp_value",iVar3,1,pcVar5);
  return iVar4;
}

Assistant:

int message_set_body_amqp_value(MESSAGE_HANDLE message, AMQP_VALUE body_amqp_value)
{
    int result;

    if ((message == NULL) ||
        (body_amqp_value == NULL))
    {
        /* Codes_SRS_MESSAGE_01_103: [ If `message` or `body_amqp_value` is NULL, `message_set_body_amqp_value` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, body_amqp_value = %p",
            message, body_amqp_value);
        result = MU_FAILURE;
    }
    else
    {
        MESSAGE_BODY_TYPE body_type = internal_get_body_type(message);
        if ((body_type == MESSAGE_BODY_TYPE_DATA) ||
            (body_type == MESSAGE_BODY_TYPE_SEQUENCE))
        {
            /* Codes_SRS_MESSAGE_01_105: [ If the body was already set to an AMQP data list or a list of AMQP sequences, `message_set_body_amqp_value` shall fail and return a non-zero value. ]*/
            LogError("Body is already set to another body type");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_154: [ Cloning the amqp value shall be done by calling `amqpvalue_clone`. ]*/
            AMQP_VALUE new_amqp_value = amqpvalue_clone(body_amqp_value);
            if (new_amqp_value == NULL)
            {
                LogError("Cannot clone body AMQP value");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_104: [ If setting the body AMQP value fails, the previous value shall be preserved. ]*/
                /* Only free the previous value when cloning is succesfull */
                if (message->body_amqp_value != NULL)
                {
                    amqpvalue_destroy(message->body_amqp_value);
                }

                /* Codes_SRS_MESSAGE_01_101: [ `message_set_body_amqp_value` shall set the contents of body as being the AMQP value indicate by `body_amqp_value`. ]*/
                message->body_amqp_value = new_amqp_value;

                /* Codes_SRS_MESSAGE_01_102: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}